

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inspect(uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  uVar6 = 0x30;
  if ((in != (uchar *)0x0 && insize != 0) && (uVar6 = 0x1b, 0x20 < insize)) {
    lodepng_info_cleanup(&state->info_png);
    (state->info_png).color.key_defined = 0;
    (state->info_png).color.key_r = 0;
    (state->info_png).color.key_g = 0;
    (state->info_png).color.key_b = 0;
    (state->info_png).color.colortype = LCT_RGBA;
    (state->info_png).color.bitdepth = 8;
    (state->info_png).color.palette = (uchar *)0x0;
    (state->info_png).color.palettesize = 0;
    (state->info_png).interlace_method = 0;
    (state->info_png).compression_method = 0;
    (state->info_png).filter_method = 0;
    (state->info_png).phys_defined = 0;
    (state->info_png).background_defined = 0;
    (state->info_png).background_r = 0;
    (state->info_png).background_g = 0;
    (state->info_png).background_b = 0;
    (state->info_png).text_num = 0;
    (state->info_png).text_keys = (char **)0x0;
    (state->info_png).text_strings = (char **)0x0;
    (state->info_png).itext_num = 0;
    (state->info_png).itext_keys = (char **)0x0;
    (state->info_png).itext_langtags = (char **)0x0;
    (state->info_png).itext_transkeys = (char **)0x0;
    (state->info_png).itext_strings = (char **)0x0;
    (state->info_png).time_defined = 0;
    (state->info_png).unknown_chunks_data[0] = (uchar *)0x0;
    (state->info_png).unknown_chunks_data[1] = (uchar *)0x0;
    (state->info_png).unknown_chunks_data[2] = (uchar *)0x0;
    (state->info_png).unknown_chunks_size[0] = 0;
    (state->info_png).unknown_chunks_size[1] = 0;
    (state->info_png).unknown_chunks_size[2] = 0;
    uVar6 = 0x1c;
    if (((((*in == 0x89) && (((in[1] == 'P' && (in[2] == 'N')) && (in[3] == 'G')))) &&
         (((in[4] == '\r' && (in[5] == '\n')) && (in[6] == '\x1a')))) &&
        ((in[7] == '\n' && (uVar6 = 0x1d, in[0xc] == 'I')))) &&
       ((in[0xd] == 'H' && ((in[0xe] == 'D' && (in[0xf] == 'R')))))) {
      uVar6 = *(uint *)(in + 0x10);
      *w = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar6 = *(uint *)(in + 0x14);
      *h = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      bVar1 = in[0x18];
      (state->info_png).color.bitdepth = (uint)bVar1;
      bVar2 = in[0x19];
      (state->info_png).color.colortype = (uint)bVar2;
      bVar3 = in[0x1a];
      (state->info_png).compression_method = (uint)bVar3;
      bVar4 = in[0x1b];
      (state->info_png).filter_method = (uint)bVar4;
      bVar5 = in[0x1c];
      (state->info_png).interlace_method = (uint)bVar5;
      uVar6 = 0x5d;
      if ((*w != 0) && (*h != 0)) {
        if ((state->decoder).ignore_crc == 0) {
          uVar7 = 0xffffffff;
          lVar8 = 0xc;
          do {
            uVar7 = uVar7 >> 8 ^ lodepng_crc32_table[(byte)(in[lVar8] ^ (byte)uVar7)];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x1d);
          uVar6 = 0x39;
          if ((uVar7 ^ ((uint)in[0x1e] << 0x10 | (uint)in[0x1d] << 0x18 | (uint)in[0x1f] << 8 |
                       (uint)in[0x20])) != 0xffffffff) goto LAB_001aa473;
        }
        uVar6 = 0x20;
        if (((bVar3 == 0) && (uVar6 = 0x21, bVar4 == 0)) && (uVar6 = 0x22, bVar5 < 2)) {
          uVar6 = checkColorValidity((uint)bVar2,(uint)bVar1);
        }
      }
    }
  }
LAB_001aa473:
  state->error = uVar6;
  return uVar6;
}

Assistant:

unsigned lodepng_inspect(unsigned* w, unsigned* h, LodePNGState* state,
                         const unsigned char* in, size_t insize)
{
  LodePNGInfo* info = &state->info_png;
  if(insize == 0 || in == 0)
  {
    CERROR_RETURN_ERROR(state->error, 48); /*error: the given data is empty*/
  }
  if(insize < 33)
  {
    CERROR_RETURN_ERROR(state->error, 27); /*error: the data length is smaller than the length of a PNG header*/
  }

  /*when decoding a new PNG image, make sure all parameters created after previous decoding are reset*/
  lodepng_info_cleanup(info);
  lodepng_info_init(info);

  if(in[0] != 137 || in[1] != 80 || in[2] != 78 || in[3] != 71
     || in[4] != 13 || in[5] != 10 || in[6] != 26 || in[7] != 10)
  {
    CERROR_RETURN_ERROR(state->error, 28); /*error: the first 8 bytes are not the correct PNG signature*/
  }
  if(in[12] != 'I' || in[13] != 'H' || in[14] != 'D' || in[15] != 'R')
  {
    CERROR_RETURN_ERROR(state->error, 29); /*error: it doesn't start with a IHDR chunk!*/
  }

  /*read the values given in the header*/
  *w = lodepng_read32bitInt(&in[16]);
  *h = lodepng_read32bitInt(&in[20]);
  info->color.bitdepth = in[24];
  info->color.colortype = (LodePNGColorType)in[25];
  info->compression_method = in[26];
  info->filter_method = in[27];
  info->interlace_method = in[28];

  if(*w == 0 || *h == 0)
  {
    CERROR_RETURN_ERROR(state->error, 93);
  }

  if(!state->decoder.ignore_crc)
  {
    unsigned CRC = lodepng_read32bitInt(&in[29]);
    unsigned checksum = lodepng_crc32(&in[12], 17);
    if(CRC != checksum)
    {
      CERROR_RETURN_ERROR(state->error, 57); /*invalid CRC*/
    }
  }

  /*error: only compression method 0 is allowed in the specification*/
  if(info->compression_method != 0) CERROR_RETURN_ERROR(state->error, 32);
  /*error: only filter method 0 is allowed in the specification*/
  if(info->filter_method != 0) CERROR_RETURN_ERROR(state->error, 33);
  /*error: only interlace methods 0 and 1 exist in the specification*/
  if(info->interlace_method > 1) CERROR_RETURN_ERROR(state->error, 34);

  state->error = checkColorValidity(info->color.colortype, info->color.bitdepth);
  return state->error;
}